

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactor.c
# Opt level: O3

InteractionReadySeat interactor_announce(Interactor *itr)

{
  Interactor *pIVar1;
  _Bool _Var2;
  InteractionReadySeat iseat;
  Interactor *pIVar3;
  char *ptr;
  char *msg;
  uint uVar4;
  char *pcVar5;
  
  iseat.seat = (*itr->vt->get_seat)(itr);
  _Var2 = is_tempseat(iseat.seat);
  if (_Var2) {
    __assert_fail("!is_tempseat(seat) && \"Shouldn\'t call announce when someone else is using our seat\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/proxy/interactor.c"
                  ,0x4f,"InteractionReadySeat interactor_announce(Interactor *)");
  }
  uVar4 = 0xffffffff;
  pIVar1 = itr;
  do {
    pIVar3 = pIVar1;
    uVar4 = uVar4 + 1;
    pIVar1 = pIVar3->parent;
  } while (pIVar3->parent != (Interactor *)0x0);
  pIVar1 = pIVar3->last_to_talk;
  if (itr->parent == (Interactor *)0x0 && pIVar1 == (Interactor *)0x0 || pIVar1 == itr) {
    return (InteractionReadySeat)iseat.seat;
  }
  if (pIVar1 != (Interactor *)0x0) {
    seat_antispoof_msg(iseat,anon_var_dwarf_3489d + 10);
  }
  ptr = (*itr->vt->description)(itr);
  if (uVar4 == 1) {
    pcVar5 = "proxy";
  }
  else {
    if (uVar4 != 0) {
      pcVar5 = dupprintf("proxy^%u",(ulong)uVar4);
      goto LAB_00146379;
    }
    pcVar5 = "primary";
  }
  pcVar5 = dupstr(pcVar5);
LAB_00146379:
  msg = dupprintf("%sMaking %s %s",anon_var_dwarf_3489d + 10,pcVar5,ptr);
  safefree(pcVar5);
  safefree(ptr);
  seat_antispoof_msg(iseat,msg);
  safefree(msg);
  pIVar3->last_to_talk = itr;
  return (InteractionReadySeat)iseat.seat;
}

Assistant:

InteractionReadySeat interactor_announce(Interactor *itr)
{
    Seat *seat = interactor_get_seat(itr);
    assert(!is_tempseat(seat) &&
           "Shouldn't call announce when someone else is using our seat");

    InteractionReadySeat iseat;
    iseat.seat = seat;

    unsigned level;
    Interactor *itr_top = interactor_toplevel(itr, &level);

    /*
     * Generally, we should announce ourself if the previous
     * Interactor that said anything was not us. That includes if
     * there was no previous Interactor to talk (i.e. if we're the
     * first to say anything) - *except* that the primary Interactor
     * doesn't need to announce itself, if no proxy has intervened
     * before it.
     */
    bool need_announcement = (itr_top->last_to_talk != itr);
    if (!itr->parent && !itr_top->last_to_talk)
        need_announcement = false;

    if (need_announcement) {
        const char *prefix = "";
        if (itr_top->last_to_talk != NULL)
            seat_antispoof_msg(iseat, ""); /* leave a separating blank line */

        char *desc = interactor_description(itr);
        char *adjective = (level == 0 ? dupstr("primary") :
                           level == 1 ? dupstr("proxy") :
                           dupprintf("proxy^%u", level));
        char *msg = dupprintf("%sMaking %s %s", prefix, adjective, desc);
        sfree(adjective);
        sfree(desc);

        seat_antispoof_msg(iseat, msg);
        sfree(msg);

        itr_top->last_to_talk = itr;
    }

    return iseat;
}